

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeListImpl.cpp
# Opt level: O3

DOMNode * __thiscall xercesc_4_0::DOMNodeListImpl::item(DOMNodeListImpl *this,XMLSize_t index)

{
  long *plVar1;
  long lVar2;
  DOMException *this_00;
  DOMNode *pDVar3;
  ulong uVar4;
  
  if (this->fNode == (DOMParentNode *)0x0) {
    pDVar3 = (DOMNode *)0x0;
  }
  else {
    pDVar3 = this->fNode->fFirstChild;
    if (pDVar3 != (DOMNode *)0x0 && index != 0) {
      uVar4 = 1;
      do {
        plVar1 = (long *)__dynamic_cast(pDVar3,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                        0xfffffffffffffffe);
        if ((plVar1 == (long *)0x0) || (lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1), lVar2 == 0))
        {
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
          __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
        }
        lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
        pDVar3 = *(DOMNode **)(lVar2 + 8);
      } while ((uVar4 < index) && (uVar4 = uVar4 + 1, pDVar3 != (DOMNode *)0x0));
    }
  }
  return pDVar3;
}

Assistant:

DOMNode *DOMNodeListImpl::item(XMLSize_t index) const{
    if (fNode) {
        DOMNode *node = fNode->fFirstChild;
        for(XMLSize_t i=0; i<index && node!=0; ++i)
            node = castToChildImpl(node)->nextSibling;
        return node;
    }
    return 0;
}